

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::detail::SocketStream::read(SocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  long lVar2;
  unsigned_long *puVar3;
  char *pcVar4;
  undefined4 in_register_00000034;
  void *ptr;
  ssize_t n;
  size_t remaining_size;
  int flags;
  ulong size;
  SocketStream *pSVar5;
  socket_t sock;
  ulong local_8;
  
  ptr = (void *)CONCAT44(in_register_00000034,__fd);
  pSVar5 = this;
  lVar2 = std::numeric_limits<long>::max();
  flags = (int)((ulong)lVar2 >> 0x20);
  sock = (socket_t)((ulong)pSVar5 >> 0x20);
  puVar3 = std::min<unsigned_long>
                     ((unsigned_long *)&stack0xffffffffffffffe0,
                      (unsigned_long *)&stack0xffffffffffffffd8);
  size = *puVar3;
  if (this->read_buff_off_ < this->read_buff_content_size_) {
    local_8 = this->read_buff_content_size_ - this->read_buff_off_;
    if (local_8 < size) {
      pcVar4 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x170ecb);
      memcpy(ptr,pcVar4 + this->read_buff_off_,local_8);
      this->read_buff_off_ = local_8 + this->read_buff_off_;
    }
    else {
      pcVar4 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x170e77);
      memcpy(ptr,pcVar4 + this->read_buff_off_,size);
      this->read_buff_off_ = size + this->read_buff_off_;
      local_8 = size;
    }
  }
  else {
    uVar1 = (*(this->super_Stream)._vptr_Stream[2])();
    if ((uVar1 & 1) == 0) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      this->read_buff_off_ = 0;
      this->read_buff_content_size_ = 0;
      if (size < 0x1000) {
        std::vector<char,_std::allocator<char>_>::data
                  ((vector<char,_std::allocator<char>_> *)0x170f5d);
        local_8 = read_socket(sock,ptr,size,flags);
        if (0 < (long)local_8) {
          if ((long)size < (long)local_8) {
            pcVar4 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)0x170fe5);
            memcpy(ptr,pcVar4,size);
            this->read_buff_off_ = size;
            this->read_buff_content_size_ = local_8;
            local_8 = size;
          }
          else {
            pcVar4 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)0x170fb0);
            memcpy(ptr,pcVar4,local_8);
          }
        }
      }
      else {
        local_8 = read_socket(sock,ptr,size,flags);
      }
    }
  }
  return local_8;
}

Assistant:

inline ssize_t SocketStream::read(char *ptr, size_t size) {
#ifdef _WIN32
  size =
      (std::min)(size, static_cast<size_t>((std::numeric_limits<int>::max)()));
#else
  size = (std::min)(size,
                    static_cast<size_t>((std::numeric_limits<ssize_t>::max)()));
#endif

  if (read_buff_off_ < read_buff_content_size_) {
    auto remaining_size = read_buff_content_size_ - read_buff_off_;
    if (size <= remaining_size) {
      memcpy(ptr, read_buff_.data() + read_buff_off_, size);
      read_buff_off_ += size;
      return static_cast<ssize_t>(size);
    } else {
      memcpy(ptr, read_buff_.data() + read_buff_off_, remaining_size);
      read_buff_off_ += remaining_size;
      return static_cast<ssize_t>(remaining_size);
    }
  }

  if (!is_readable()) { return -1; }

  read_buff_off_ = 0;
  read_buff_content_size_ = 0;

  if (size < read_buff_size_) {
    auto n = read_socket(sock_, read_buff_.data(), read_buff_size_,
                         CPPHTTPLIB_RECV_FLAGS);
    if (n <= 0) {
      return n;
    } else if (n <= static_cast<ssize_t>(size)) {
      memcpy(ptr, read_buff_.data(), static_cast<size_t>(n));
      return n;
    } else {
      memcpy(ptr, read_buff_.data(), size);
      read_buff_off_ = size;
      read_buff_content_size_ = static_cast<size_t>(n);
      return static_cast<ssize_t>(size);
    }
  } else {
    return read_socket(sock_, ptr, size, CPPHTTPLIB_RECV_FLAGS);
  }
}